

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,false>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  int *idata;
  AggregateUnaryInput input_data;
  undefined1 local_70 [72];
  
  if (*input != (Vector)0x0) {
    if (*input == (Vector)0x2) {
      if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
        local_70._8_8_ = input + 0x28;
        local_70._16_8_ = 0;
        local_70._0_8_ = aggr_input_data;
        QuantileOperation::
        ConstantOperation<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<int,false>>
                  ((QuantileState<int,_duckdb::QuantileStandardType> *)state,*(int **)(input + 0x20)
                   ,(AggregateUnaryInput *)local_70,count);
      }
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
      duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
      UnaryUpdateLoop<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,false>>
                ((int *)local_70._8_8_,aggr_input_data,
                 (QuantileState<int,_duckdb::QuantileStandardType> *)state,count,
                 (ValidityMask *)(local_70 + 0x10),(SelectionVector *)local_70._0_8_);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
    }
    return;
  }
  idata = *(int **)(input + 0x20);
  FlatVector::VerifyFlatVector(input);
  UnaryFlatUpdateLoop<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,false>>
            (idata,aggr_input_data,(QuantileState<int,_duckdb::QuantileStandardType> *)state,count,
             (ValidityMask *)(input + 0x28));
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}